

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O3

HttpResponse * asl::Http::request(HttpResponse *__return_storage_ptr__,HttpRequest *request)

{
  AtomicCount *pAVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  size_t in_RCX;
  sockaddr *__addr;
  void *__buf;
  anon_union_16_2_78e7fdac_for_String_2 *paVar6;
  undefined8 uVar7;
  Socket socket;
  String title;
  Array<asl::String> parts;
  String loc;
  Url url;
  String line;
  HttpResponse response;
  SmartObject local_2b8;
  String local_2b0;
  undefined1 local_298 [16];
  anon_union_16_2_78e7fdac_for_String_2 local_288;
  String local_278;
  Url local_260;
  String local_210;
  HttpResponse local_1f8;
  HttpRequest local_170;
  
  local_2b8._p = (SmartObject_ *)0x0;
  HttpResponse::HttpResponse(&local_1f8,request);
  HttpResponse::setCode(&local_1f8,0);
  Url::Url(&local_260,&request->_url);
  iVar4 = local_260.port;
  uVar7 = local_260.protocol.field_2._str;
  if (local_260.protocol._size == 0) {
    uVar7 = &local_260.protocol.field_2;
  }
  iVar3 = strcmp((char *)uVar7,"https");
  if (iVar3 == 0) {
    String::String((String *)&local_170,"SOCKET_NO_TLS_AVAILABLE");
    uVar7 = local_170.super_HttpMessage._command.field_2._str;
    if (local_170.super_HttpMessage._command._size == 0) {
      uVar7 = &local_170.super_HttpMessage._command.field_2;
    }
    String::assign(&local_1f8.super_HttpMessage._socketError,(char *)uVar7,
                   local_170.super_HttpMessage._command._len);
    if (local_170.super_HttpMessage._command._size != 0) {
      free(local_170.super_HttpMessage._command.field_2._str);
    }
    HttpMessage::HttpMessage
              (&__return_storage_ptr__->super_HttpMessage,&local_1f8.super_HttpMessage);
  }
  else {
    Socket::Socket((Socket *)&local_170);
    if ((Socket_ *)local_2b8._p != (Socket_ *)0x0) {
      LOCK();
      pAVar1 = &(local_2b8._p)->rc;
      pAVar1->n = pAVar1->n + -1;
      UNLOCK();
      if ((pAVar1->n == 0) && ((Socket_ *)local_2b8._p != (Socket_ *)0x0)) {
        (*((SmartObject_ *)&(local_2b8._p)->_vptr_SmartObject_)->_vptr_SmartObject_[1])();
      }
    }
    local_2b8._p = (SmartObject_ *)
                   CONCAT44(local_170.super_HttpMessage._command._len,
                            local_170.super_HttpMessage._command._size);
    if ((Socket_ *)local_2b8._p != (Socket_ *)0x0) {
      LOCK();
      pAVar1 = &(((Socket_ *)local_2b8._p)->super_SmartObject_).rc;
      pAVar1->n = pAVar1->n + 1;
      UNLOCK();
      if (CONCAT44(local_170.super_HttpMessage._command._len,
                   local_170.super_HttpMessage._command._size) != 0) {
        LOCK();
        piVar2 = (int *)(CONCAT44(local_170.super_HttpMessage._command._len,
                                  local_170.super_HttpMessage._command._size) + 8);
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) &&
           ((long *)CONCAT44(local_170.super_HttpMessage._command._len,
                             local_170.super_HttpMessage._command._size) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_170.super_HttpMessage._command._len,
                                         local_170.super_HttpMessage._command._size) + 8))();
        }
      }
    }
    if (iVar4 == 0) {
      local_260.port = 0x50;
      __addr = (sockaddr *)0x50;
    }
    else {
      __addr = (sockaddr *)(ulong)(uint)local_260.port;
    }
    (request->super_HttpMessage)._socket = (Socket *)&local_2b8;
    local_1f8.super_HttpMessage._socket = (Socket *)&local_2b8;
    iVar3 = Socket::connect((Socket *)&local_2b8,(int)&local_260 + 0x18,__addr,(socklen_t)in_RCX);
    if ((char)iVar3 != '\0') {
      if (*(int *)((request->super_HttpMessage)._body._a + -0x10) != 0) {
        String::String((String *)&local_170,"Content-Length");
        String::String(&local_2b0,*(int *)((request->super_HttpMessage)._body._a + -0x10));
        HttpMessage::setHeader(&request->super_HttpMessage,(String *)&local_170,&local_2b0);
        if (local_2b0._size != 0) {
          free((void *)CONCAT71(local_2b0.field_2._1_7_,local_2b0.field_2._space[0]));
        }
        if (local_170.super_HttpMessage._command._size != 0) {
          free(local_170.super_HttpMessage._command.field_2._str);
        }
      }
      local_2b0.field_2._space[0] = '\0';
      local_2b0._size = 0;
      local_2b0._len = 0;
      if ((request->_method)._size == 0) {
        paVar6 = &(request->_method).field_2;
      }
      else {
        paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(request->_method).field_2._str;
      }
      String::append(&local_2b0,paVar6->_space,(request->_method)._len);
      String::operator+=(&local_2b0,' ');
      uVar7 = local_260.path.field_2._str;
      if (local_260.path._size == 0) {
        uVar7 = &local_260.path.field_2;
      }
      String::append(&local_2b0,(char *)uVar7,local_260.path._len);
      String::append(&local_2b0," HTTP/1.1\r\nHost: ",0x11);
      uVar7 = local_260.host.field_2._str;
      if (local_260.host._size == 0) {
        uVar7 = &local_260.host.field_2;
      }
      String::append(&local_2b0,(char *)uVar7,local_260.host._len);
      if (iVar4 != 0) {
        String::operator+=(&local_2b0,':');
        String::operator<<(&local_2b0,&local_260.port);
      }
      if (local_2b0._size == 0) {
        paVar6 = &local_2b0.field_2;
      }
      else {
        paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)
                 CONCAT71(local_2b0.field_2._1_7_,local_2b0.field_2._space[0]);
      }
      String::assign((String *)request,paVar6->_space,local_2b0._len);
      sVar5 = HttpMessage::write(&request->super_HttpMessage,(int)paVar6,__buf,in_RCX);
      if ((char)sVar5 == '\0') {
        (*((SmartObject_ *)&(local_2b8._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0x10])
                  (&local_170);
        uVar7 = local_170.super_HttpMessage._command.field_2._str;
        if (local_170.super_HttpMessage._command._size == 0) {
          uVar7 = &local_170.super_HttpMessage._command.field_2;
        }
        String::assign(&local_1f8.super_HttpMessage._socketError,(char *)uVar7,
                       local_170.super_HttpMessage._command._len);
        if (local_170.super_HttpMessage._command._size != 0) {
          free(local_170.super_HttpMessage._command.field_2._str);
        }
        HttpMessage::HttpMessage
                  (&__return_storage_ptr__->super_HttpMessage,&local_1f8.super_HttpMessage);
        __return_storage_ptr__->_code = local_1f8._code;
      }
      else {
        Socket_::readLine(&local_210,(Socket_ *)local_2b8._p);
        if (local_210._len < 1) {
          (*((SmartObject_ *)&(local_2b8._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0xb])();
          (*((SmartObject_ *)&(local_2b8._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0x10])
                    (&local_170);
          uVar7 = local_170.super_HttpMessage._command.field_2._str;
          if (local_170.super_HttpMessage._command._size == 0) {
            uVar7 = &local_170.super_HttpMessage._command.field_2;
          }
          String::assign(&local_1f8.super_HttpMessage._socketError,(char *)uVar7,
                         local_170.super_HttpMessage._command._len);
          if (local_170.super_HttpMessage._command._size != 0) {
            free(local_170.super_HttpMessage._command.field_2._str);
          }
          HttpMessage::HttpMessage
                    (&__return_storage_ptr__->super_HttpMessage,&local_1f8.super_HttpMessage);
          __return_storage_ptr__->_code = local_1f8._code;
        }
        else {
          String::split((String *)local_298);
          if (*(int *)&((String *)(local_298._0_8_ + -0x18))->field_2 < 2) {
            (*((SmartObject_ *)&(local_2b8._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0xb])();
            (*((SmartObject_ *)&(local_2b8._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0x10])
                      (&local_170);
            uVar7 = local_170.super_HttpMessage._command.field_2._str;
            if (local_170.super_HttpMessage._command._size == 0) {
              uVar7 = &local_170.super_HttpMessage._command.field_2;
            }
            String::assign(&local_1f8.super_HttpMessage._socketError,(char *)uVar7,
                           local_170.super_HttpMessage._command._len);
            if (local_170.super_HttpMessage._command._size != 0) {
              free(local_170.super_HttpMessage._command.field_2._str);
            }
            HttpMessage::HttpMessage
                      (&__return_storage_ptr__->super_HttpMessage,&local_1f8.super_HttpMessage);
LAB_00123c3a:
            __return_storage_ptr__->_code = local_1f8._code;
          }
          else {
            if (*(int *)local_298._0_8_ == 0) {
              paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(local_298._0_8_ + 8);
            }
            else {
              paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)
                       ((anon_union_16_2_78e7fdac_for_String_2 *)(local_298._0_8_ + 8))->_str;
            }
            String::assign(&local_1f8.super_HttpMessage._proto,paVar6->_space,
                           *(int *)(local_298._0_8_ + 4));
            if (((String *)(local_298._0_8_ + 0x18))->_size == 0) {
              paVar6 = &((String *)(local_298._0_8_ + 0x18))->field_2;
            }
            else {
              paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)
                       (((String *)(local_298._0_8_ + 0x18))->field_2)._str;
            }
            iVar4 = myatoi(paVar6->_space);
            HttpResponse::setCode(&local_1f8,iVar4);
            HttpMessage::readHeaders(&local_1f8.super_HttpMessage);
            if (((request->_followRedirects != true) || (7 < local_1f8._code - 0x12dU)) ||
               ((0xc3U >> (local_1f8._code - 0x12dU & 0x1f) & 1) == 0)) {
              local_1f8.super_HttpMessage._progress.f = (request->super_HttpMessage)._progress.f;
              (request->super_HttpMessage)._progress.f =
                   (_FuncB<void,_const_asl::HttpStatus_&,_asl::NoType> *)0x0;
              HttpMessage::useSink(&local_1f8.super_HttpMessage,&(request->super_HttpMessage)._sink)
              ;
              HttpMessage::readBody(&local_1f8.super_HttpMessage);
              (*((SmartObject_ *)&(local_2b8._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0xb])();
              HttpMessage::HttpMessage
                        (&__return_storage_ptr__->super_HttpMessage,&local_1f8.super_HttpMessage);
              goto LAB_00123c3a;
            }
            (*((SmartObject_ *)&(local_2b8._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0xb])();
            String::String((String *)&local_170,"Location");
            HttpMessage::header(&local_278,&local_1f8.super_HttpMessage,(String *)&local_170);
            if (local_170.super_HttpMessage._command._size != 0) {
              free(local_170.super_HttpMessage._command.field_2._str);
            }
            HttpRequest::HttpRequest(&local_170,request);
            local_170.super_HttpMessage._headersSent = false;
            uVar7 = local_278.field_2._str;
            if (local_278._size == 0) {
              uVar7 = &local_278.field_2;
            }
            String::assign(&local_170._url,(char *)uVar7,local_278._len);
            if (request->_recursion < 3) {
              local_170._recursion = request->_recursion + 1;
              Http::request(__return_storage_ptr__,&local_170);
            }
            else {
              HttpResponse::setCode(&local_1f8,0x1a5);
              String::String((String *)(local_298 + 8),"Too many redirects");
              uVar7 = local_288._0_8_;
              if (local_298._8_4_ == 0) {
                uVar7 = &local_288;
              }
              String::assign(&local_1f8.super_HttpMessage._socketError,(char *)uVar7,
                             local_298._12_4_);
              if (local_298._8_4_ != 0) {
                free((void *)local_288._0_8_);
              }
              HttpMessage::HttpMessage
                        (&__return_storage_ptr__->super_HttpMessage,&local_1f8.super_HttpMessage);
              __return_storage_ptr__->_code = local_1f8._code;
            }
            HttpRequest::~HttpRequest(&local_170);
            if (local_278._size != 0) {
              free(local_278.field_2._str);
            }
          }
          Array<asl::String>::~Array((Array<asl::String> *)local_298);
        }
        if (local_210._size != 0) {
          free(local_210.field_2._str);
        }
      }
      if (local_2b0._size != 0) {
        free((void *)CONCAT71(local_2b0.field_2._1_7_,local_2b0.field_2._space[0]));
      }
      goto LAB_00123c79;
    }
    (*((SmartObject_ *)&(local_2b8._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0xb])();
    (*((SmartObject_ *)&(local_2b8._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0x10])(&local_170);
    uVar7 = local_170.super_HttpMessage._command.field_2._str;
    if (local_170.super_HttpMessage._command._size == 0) {
      uVar7 = &local_170.super_HttpMessage._command.field_2;
    }
    String::assign(&local_1f8.super_HttpMessage._socketError,(char *)uVar7,
                   local_170.super_HttpMessage._command._len);
    if (local_170.super_HttpMessage._command._size != 0) {
      free(local_170.super_HttpMessage._command.field_2._str);
    }
    HttpMessage::HttpMessage
              (&__return_storage_ptr__->super_HttpMessage,&local_1f8.super_HttpMessage);
  }
  __return_storage_ptr__->_code = local_1f8._code;
LAB_00123c79:
  if (local_260.path._size != 0) {
    free(local_260.path.field_2._str);
  }
  if (local_260.host._size != 0) {
    free(local_260.host.field_2._str);
  }
  if (local_260.protocol._size != 0) {
    free(local_260.protocol.field_2._str);
  }
  HttpMessage::~HttpMessage(&local_1f8.super_HttpMessage);
  if ((Socket_ *)local_2b8._p != (Socket_ *)0x0) {
    LOCK();
    pAVar1 = &(local_2b8._p)->rc;
    pAVar1->n = pAVar1->n + -1;
    UNLOCK();
    if ((pAVar1->n == 0) && ((Socket_ *)local_2b8._p != (Socket_ *)0x0)) {
      (*((SmartObject_ *)&(local_2b8._p)->_vptr_SmartObject_)->_vptr_SmartObject_[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

HttpResponse Http::request(HttpRequest& request)
{
	Socket socket((Socket::Ptr)NULL);
	HttpResponse response(request);
	response.setCode(0);

	Url url(request.url());
	bool hasPort = url.port != 0;

	if (url.protocol == "https")
	{
#ifdef ASL_TLS
		socket = TlsSocket();
		if (!hasPort) url.port = 443;
#else
		response.setSockError("SOCKET_NO_TLS_AVAILABLE");
		return response;
#endif
	}
	else {
		socket = Socket();
		if (!hasPort) url.port = 80;
	}

	response.use(socket);
	request.use(socket);

	if (!socket.connect(url.host, url.port)) {
		//printf("Cannot connect to %s : %i\n", *url.host, url.port);
		socket.close();
		response.setSockError(socket.errorMsg());
		return response;
	}
	
	if (request.body().length() != 0) {
		request.setHeader("Content-Length", request.body().length());
	}

	String title;
	title << request.method() << ' ' << url.path << " HTTP/1.1\r\nHost: " << url.host;
	if (hasPort)
		title << ':' << url.port;
	request._command = title;

	if (!request.write())
	{
		response.setSockError(socket.errorMsg());
		return response;
	}
	
	String line = socket.readLine();
	if (!line.ok()) {
		socket.close();
		response.setSockError(socket.errorMsg());
		return response;
	}
	Array<String> parts = line.split();
	if (parts.length() < 2) {
		socket.close();
		response.setSockError(socket.errorMsg());
		return response;
	}

	response.setProto(parts[0]);
	response.setCode(parts[1]);
	response.readHeaders();

	int code = response.code();

	if (request.followRedirects() && (code == 301 || code == 302 || code == 307 || code == 308)) // 303 ?
	{
		socket.close();
		String loc = response.header("Location");
		HttpRequest req(request);
		req.setUrl(loc);
		Http::Progress progress = req._progress;
		req.onProgress(progress);
		int n = request.recursion() + 1;
		if (n < 4) {
			req.setRecursion(n);
			return Http::request(req);
		}
		else {
			response.setCode(421);
			response.setSockError("Too many redirects");
			return response;
		}
	}

	response.onProgress(request._progress);
	response.useSink(request._sink);

	response.readBody();

	socket.close();
	return response;
}